

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O2

int __thiscall
Centaurus::ChaserEM64T<unsigned_char>::init(ChaserEM64T<unsigned_char> *this,EVP_PKEY_CTX *ctx)

{
  CodeHolder *this_00;
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  int extraout_EAX;
  mapped_type *pmVar4;
  ulong uVar5;
  mapped_type *pp_Var6;
  socklen_t __len;
  ErrorHandler *in_RCX;
  key_type *__k;
  Logger *in_RDX;
  sockaddr *__addr;
  EVP_PKEY_CTX *pEVar7;
  Data128 DVar8;
  char *func_base;
  X86Mem skipfilter_mem;
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  machinelabels;
  CompositeATN<unsigned_char> catn;
  MyConstPool pool;
  X86Assembler as;
  EVP_PKEY_CTX *local_2f8;
  anon_union_16_7_ed616b9d_for_Operand__0 local_2e0;
  JitRuntime *local_2d0;
  CodeHolder *local_2c8;
  Operand_ *local_2c0;
  Operand_ *local_2b8;
  Operand_ *local_2b0;
  undefined1 local_2a8 [32];
  _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_288;
  anon_union_16_7_ed616b9d_for_Operand__0 local_248 [4];
  anon_union_16_7_ed616b9d_for_Operand__0 local_200 [2];
  UInt64 local_1d8;
  anon_union_8_2_78723da6_for_MemData_2 aStack_1d0;
  undefined1 local_f8 [16];
  Assembler local_e8;
  
  this_00 = &this->m_code;
  asmjit::CodeHolder::init
            (this_00,(EVP_PKEY_CTX *)&(this->m_runtime).super_HostRuntime.super_Runtime._codeInfo);
  if (in_RDX != (Logger *)0x0) {
    asmjit::CodeHolder::setLogger(this_00,in_RDX);
  }
  if (in_RCX != (ErrorHandler *)0x0) {
    asmjit::CodeHolder::setErrorHandler(this_00,in_RCX);
  }
  local_2d0 = &this->m_runtime;
  local_288._M_buckets = &local_288._M_single_bucket;
  local_288._M_bucket_count = 1;
  local_288._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_288._M_element_count._0_4_ = 0;
  local_288._M_element_count._4_4_ = 0;
  local_288._M_rehash_policy._M_max_load_factor = 1.0;
  local_288._M_rehash_policy._M_next_resize = 0;
  local_288._M_single_bucket = (__node_base_ptr)0x0;
  local_2c8 = this_00;
  asmjit::X86Assembler::X86Assembler((X86Assembler *)&local_e8,this_00);
  local_2f8 = ctx + 0x20;
  pEVar7 = local_2f8;
  while (pEVar7 = *(EVP_PKEY_CTX **)pEVar7, pEVar7 != (EVP_PKEY_CTX *)0x0) {
    asmjit::Assembler::newLabel((Assembler *)&local_248[0]._any);
    Identifier::Identifier((Identifier *)&local_200[0]._any,(Identifier *)(pEVar7 + 8));
    local_1d8 = (UInt64)local_248[0]._0_8_;
    aStack_1d0 = (anon_union_8_2_78723da6_for_MemData_2)local_248[0]._8_8_;
    std::
    _Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,asmjit::Label>,std::allocator<std::pair<Centaurus::Identifier_const,asmjit::Label>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<Centaurus::Identifier,asmjit::Label>>
              ((_Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,asmjit::Label>,std::allocator<std::pair<Centaurus::Identifier_const,asmjit::Label>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_288,local_200);
    Identifier::~Identifier((Identifier *)&local_200[0]._any);
  }
  MyConstPool::MyConstPool((MyConstPool *)&local_200[0]._any,(X86Assembler *)&local_e8);
  DVar8 = pack_charclass((CharClass<unsigned_char> *)m_skipfilter);
  DVar8.sq[1] = DVar8.sq[0];
  DVar8.sq[0] = (int64_t)local_200;
  MyConstPool::add((MyConstPool *)(local_2a8 + 0x10),DVar8);
  CompositeATN<unsigned_char>::CompositeATN
            ((CompositeATN<unsigned_char> *)&local_248[0]._any,(Grammar<unsigned_char> *)ctx);
  __k = (key_type *)(asmjit::x86OpData + 0x4e0);
  local_2b0 = (Operand_ *)(asmjit::x86OpData + 0x500);
  local_2b8 = (Operand_ *)(asmjit::x86OpData + 0x4e0);
  local_2c0 = (Operand_ *)(asmjit::x86OpData + 0x710);
  pEVar7 = local_2f8;
  while( true ) {
    __len = (socklen_t)__k;
    pEVar7 = *(EVP_PKEY_CTX **)pEVar7;
    if (pEVar7 == (EVP_PKEY_CTX *)0x0) break;
    asmjit::Assembler::newLabel((Assembler *)local_2a8);
    __k = (key_type *)(pEVar7 + 8);
    pmVar4 = std::__detail::
             _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&local_288,__k);
    asmjit::Assembler::bind(&local_e8,(int)pmVar4,__addr,__len);
    emit_parser_prolog((X86Assembler *)&local_e8);
    local_2e0._packed[0] = (UInt64)0x32;
    local_2e0._any.reserved12_4 = 4;
    local_2e0._any.reserved8_4 = 0x20;
    asmjit::CodeEmitter::emit
              (&local_e8.super_CodeEmitter,0x189,local_2b0,(Operand_ *)&local_2e0._any);
    local_2e0._packed[0] = (UInt64)0x32;
    local_2e0._any.reserved12_4 = 4;
    local_2e0._any.reserved8_4 = 0x18;
    asmjit::CodeEmitter::emit
              (&local_e8.super_CodeEmitter,0x189,local_2b8,(Operand_ *)&local_2e0._any);
    asmjit::CodeEmitter::emit
              (&local_e8.super_CodeEmitter,400,local_2c0,(Operand_ *)(local_2a8 + 0x10));
    emit_machine(this,(X86Assembler *)&local_e8,(Grammar<unsigned_char> *)ctx,__k,
                 (CompositeATN<unsigned_char> *)&local_248[0]._any,(Label *)local_2a8,
                 (MyConstPool *)&local_200[0]._any);
    emit_parser_epilog((X86Assembler *)&local_e8,(Label *)local_2a8);
  }
  (**(code **)(*(long *)local_200[0]._0_8_ + 0x68))(local_200[0]._packed[0].i64,local_f8,&local_1d8)
  ;
  asmjit::CodeEmitter::finalize(&local_e8.super_CodeEmitter);
  (*(this->m_runtime).super_HostRuntime.super_Runtime._vptr_Runtime[2])
            (local_2d0,local_2a8,local_2c8);
  pEVar7 = local_2f8;
  while( true ) {
    uVar3 = local_2a8._0_8_;
    pEVar7 = *(EVP_PKEY_CTX **)pEVar7;
    if (pEVar7 == (EVP_PKEY_CTX *)0x0) {
      while (local_2f8 = *(EVP_PKEY_CTX **)local_2f8, local_2f8 != (EVP_PKEY_CTX *)0x0) {
        iVar1 = *(int *)(local_2f8 + 0x50);
        if ((ulong)((long)(this->m_funcarray).
                          super__Vector_base<void_*(*)(void_*,_const_void_*),_std::allocator<void_*(*)(void_*,_const_void_*)>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_funcarray).
                          super__Vector_base<void_*(*)(void_*,_const_void_*),_std::allocator<void_*(*)(void_*,_const_void_*)>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)(long)iVar1) {
          std::
          vector<void_*(*)(void_*,_const_void_*),_std::allocator<void_*(*)(void_*,_const_void_*)>_>
          ::resize(&this->m_funcarray,(long)(iVar1 + 1));
        }
        pp_Var6 = std::__detail::
                  _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>,_std::allocator<std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>,_std::allocator<std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->m_funcmap,(key_type *)(local_2f8 + 8));
        (this->m_funcarray).
        super__Vector_base<void_*(*)(void_*,_const_void_*),_std::allocator<void_*(*)(void_*,_const_void_*)>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar1] = *pp_Var6;
      }
      CompositeATN<unsigned_char>::~CompositeATN((CompositeATN<unsigned_char> *)&local_248[0]._any);
      MyConstPool::~MyConstPool((MyConstPool *)&local_200[0]._any);
      asmjit::X86Assembler::~X86Assembler((X86Assembler *)&local_e8);
      std::
      _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_288);
      return extraout_EAX;
    }
    pmVar4 = std::__detail::
             _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&local_288,(key_type *)(pEVar7 + 8));
    uVar5 = (ulong)((pmVar4->super_Operand).super_Operand_.field_0._any.id - 0x100);
    if ((this->m_code)._labels.super_ZoneVectorBase._length <= uVar5) break;
    lVar2 = *(long *)(*(long *)((long)(this->m_code)._labels.super_ZoneVectorBase._data + uVar5 * 8)
                     + 0x20);
    pp_Var6 = std::__detail::
              _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>,_std::allocator<std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>,_std::allocator<std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->m_funcmap,(key_type *)(pEVar7 + 8));
    *pp_Var6 = (mapped_type)(uVar3 + lVar2);
  }
  asmjit::DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/././base/../base/../base/codeholder.h"
             ,0x298,"isLabelValid(id)");
}

Assistant:

void ChaserEM64T<TCHAR>::init(const Grammar<TCHAR>& grammar, asmjit::Logger *logger, asmjit::ErrorHandler *errhandler)
{
	m_code.init(m_runtime.getCodeInfo());
	if (logger != NULL)
		m_code.setLogger(logger);
	if (errhandler != NULL)
		m_code.setErrorHandler(errhandler);
	
	std::unordered_map<Identifier, asmjit::Label> machinelabels;

	asmjit::X86Assembler as(&m_code);

	for (const auto& p : grammar)
	{
		machinelabels.emplace(std::pair<Identifier, asmjit::Label>(p.first, as.newLabel()));
	}
	
	MyConstPool pool(as);

    asmjit::X86Mem skipfilter_mem = pool.add(pack_charclass(m_skipfilter));

    CompositeATN<TCHAR> catn(grammar);

	for (const auto& p : grammar)
	{
		asmjit::Label rejectlabel = as.newLabel();

		as.bind(machinelabels[p.first]);

		emit_parser_prolog(as);

        as.mov(CONTEXT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG1_STACK_OFFSET));
        as.mov(INPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG2_STACK_OFFSET));
        as.movdqa(PATTERN_REG, skipfilter_mem);

		emit_machine(as, grammar, p.first, catn, rejectlabel, pool);

		emit_parser_epilog(as, rejectlabel);
	}

	pool.embed();

	as.finalize();

    char *func_base;
	m_runtime.add(&func_base, &m_code);

    for (const auto& p : grammar)
    {
        m_funcmap[p.first] = reinterpret_cast<ChaserFunc>(func_base + m_code.getLabelOffset(machinelabels[p.first]));
    }

    for (const auto& p : grammar)
    {
        int id = p.second.get_unique_id();
        if (m_funcarray.size() <= id)
            m_funcarray.resize(id + 1);
        m_funcarray[id] = m_funcmap[p.first];
    }
}